

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::UniformBlockCase::iterate(UniformBlockCase *this)

{
  ShaderInterface *this_00;
  pointer *pppSVar1;
  UniformBlock *pUVar2;
  _Alloc_hider __s;
  iterator __position;
  RenderContext *renderCtx;
  mapped_type pvVar3;
  code *pcVar4;
  void *pvVar5;
  pointer piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer puVar9;
  pointer pcVar10;
  int iVar11;
  DataType DVar12;
  deUint32 dVar13;
  deBool dVar14;
  deUint32 dVar15;
  DataType DVar16;
  undefined4 extraout_var;
  long *plVar17;
  ulong uVar18;
  pointer pBVar19;
  mapped_type *ppvVar20;
  pointer pBVar21;
  pointer pBVar22;
  char *pcVar23;
  size_t sVar24;
  pointer ppUVar25;
  mapped_type_conflict *pmVar26;
  TestError *this_01;
  uint uVar27;
  int iVar28;
  int iVar29;
  _func_int **pp_Var30;
  long *plVar31;
  pointer ppUVar32;
  pointer pBVar33;
  deUint32 binding;
  pointer pUVar34;
  deUint32 binding_1;
  ulong uVar35;
  pointer pBVar36;
  long lVar37;
  undefined1 isVertex;
  uint uVar38;
  ulong in_R9;
  pointer pUVar39;
  long lVar40;
  undefined1 auVar41 [8];
  pointer pBVar42;
  bool bVar43;
  bool bVar44;
  int numActiveUniforms;
  int curOffset;
  int numActiveBlocks;
  UniformLayout glLayout;
  UniformBufferManager bufferManager;
  int nameLen;
  deUint32 type;
  int size_1;
  GLsizei nameLen_1;
  UniformLayout refLayout;
  vector<int,_std::allocator<int>_> blockIndices;
  int numBlockUniforms;
  Random rnd;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<char,_std::allocator<char>_> nameBuf_1;
  vector<int,_std::allocator<int>_> rowMajorFlags;
  vector<int,_std::allocator<int>_> matrixStrides;
  vector<int,_std::allocator<int>_> arrayStrides;
  vector<int,_std::allocator<int>_> offsets;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> blockPointers;
  ostringstream vtxSrc;
  ShaderProgram program;
  ostringstream fragSrc;
  char *local_7d8;
  int local_7cc;
  UniformBlockCase *local_7c8;
  long local_7c0;
  UniformBlock *local_7b8;
  undefined1 local_7b0 [32];
  _Base_ptr local_790;
  size_t local_788;
  int local_780;
  int local_77c;
  undefined1 local_778 [24];
  vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  vStack_760;
  TestLog *local_740;
  string local_738;
  vector<int,_std::allocator<int>_> local_718;
  ulong local_700;
  int local_6f4;
  int local_6f0;
  int local_6ec;
  UniformLayout local_6e8;
  vector<int,_std::allocator<int>_> local_6b8;
  pointer local_6a0;
  ulong local_698;
  vector<int,_std::allocator<int>_> local_690;
  ulong local_678;
  ulong local_670;
  ulong local_668;
  long local_660;
  undefined1 local_658 [8];
  undefined1 auStack_650 [8];
  undefined1 local_648 [16];
  _Alloc_hider local_638;
  pointer local_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_628 [4];
  ios_base local_5e8 [8];
  ios_base local_5e0 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_5c8;
  undefined1 local_5a8 [208];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4d8;
  vector<char,_std::allocator<char>_> local_4b8;
  vector<int,_std::allocator<int>_> local_4a0;
  vector<int,_std::allocator<int>_> local_488;
  vector<int,_std::allocator<int>_> local_470;
  vector<int,_std::allocator<int>_> local_458;
  ulong local_440;
  long local_438;
  ulong local_430;
  pointer local_428;
  undefined1 local_420 [16];
  pointer local_410;
  pointer local_408;
  pointer local_400;
  pointer local_3f8;
  undefined1 local_3f0 [16];
  _func_int *local_3e0;
  long lStack_3d8;
  ios_base local_380 [264];
  ShaderProgram local_278;
  undefined1 local_1a8 [16];
  _func_int *local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_740 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar11 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  local_7c0 = CONCAT44(extraout_var,iVar11);
  local_6e8.uniforms.
  super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6e8.uniforms.
  super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e8.blocks.
  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6e8.uniforms.
  super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e8.blocks.
  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6e8.blocks.
  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408 = (pointer)(local_420 + 8);
  local_420._8_4_ = _S_red;
  local_410 = (pointer)0x0;
  local_3f8 = (pointer)0x0;
  local_7c8 = this;
  local_400 = local_408;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  local_700 = (ulong)((long)(local_7c8->m_interface).m_uniformBlocks.
                            super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_7c8->m_interface).m_uniformBlocks.
                           super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if (0 < (int)(uint)local_700) {
    pppSVar1 = &local_278.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    local_700 = (ulong)((uint)local_700 & 0x7fffffff);
    uVar35 = 0;
    do {
      pUVar2 = (local_7c8->m_interface).m_uniformBlocks.
               super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar35];
      local_668 = uVar35;
      if (((pUVar2->m_instanceName)._M_string_length == 0) ||
         ((pUVar2->m_instanceName)._M_dataplus._M_p == (pointer)0x0)) {
        local_3f0._0_8_ = &local_3e0;
        local_3f0._8_8_ = 0;
        local_3e0 = (_func_int *)((ulong)local_3e0 & 0xffffffffffffff00);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_658,(pUVar2->m_blockName)._M_dataplus._M_p,
                   (allocator<char> *)local_1a8);
        plVar17 = (long *)std::__cxx11::string::append((char *)local_658);
        local_3f0._0_8_ = &local_3e0;
        pp_Var30 = (_func_int **)(plVar17 + 2);
        if ((_func_int **)*plVar17 == pp_Var30) {
          local_3e0 = *pp_Var30;
          lStack_3d8 = plVar17[3];
        }
        else {
          local_3e0 = *pp_Var30;
          local_3f0._0_8_ = (_func_int **)*plVar17;
        }
        local_3f0._8_8_ = plVar17[1];
        *plVar17 = (long)pp_Var30;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        if (local_658 != (undefined1  [8])(auStack_650 + 8)) {
          operator_delete((void *)local_658,local_648._0_8_ + 1);
        }
      }
      local_7b0._0_8_ = local_7b0._0_8_ & 0xffffffff00000000;
      uVar35 = (ulong)((long)local_6e8.uniforms.
                             super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_6e8.uniforms.
                            super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 6;
      pUVar34 = (pUVar2->m_uniforms).
                super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_780 = 0;
      local_6a0 = (pointer)((ulong)local_6a0 & 0xffffffff00000000);
      local_7b8 = pUVar2;
      local_698 = uVar35;
      if (pUVar34 !=
          (pUVar2->m_uniforms).
          super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        uVar35 = (long)local_6e8.blocks.
                       super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_6e8.blocks.
                       super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_658 = (undefined1  [8])(auStack_650 + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_658,local_3f0._0_8_,local_3f0._8_8_ + local_3f0._0_8_);
          std::__cxx11::string::append((char *)local_658);
          uVar38 = pUVar34->m_flags;
          uVar27 = uVar38;
          if ((uVar38 & 0x38) == 0) {
            uVar27 = local_7b8->m_flags;
          }
          if ((uVar38 & 0xc0) == 0) {
            uVar38 = local_7b8->m_flags;
          }
          uVar38 = uVar38 & 0xc0 | uVar27 & 0x38;
          in_R9 = (ulong)uVar38;
          ub::anon_unknown_12::computeStd140Layout
                    (&local_6e8,(int *)local_7b0,(int)(uVar35 >> 6),(string *)local_658,
                     &pUVar34->m_type,uVar38);
          if (local_658 != (undefined1  [8])(auStack_650 + 8)) {
            operator_delete((void *)local_658,local_648._0_8_ + 1);
          }
          pUVar34 = pUVar34 + 1;
        } while (pUVar34 !=
                 (local_7b8->m_uniforms).
                 super__Vector_base<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        local_6a0 = (pointer)CONCAT44(local_6a0._4_4_,local_7b0._0_4_);
        uVar35 = (ulong)((long)local_6e8.uniforms.
                               super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_6e8.uniforms.
                              super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6;
      }
      iVar11 = local_7b8->m_arraySize;
      if (local_7b8->m_arraySize < 2) {
        iVar11 = 1;
      }
      local_660 = CONCAT44(local_660._4_4_,iVar11);
      do {
        local_658 = (undefined1  [8])(auStack_650 + 8);
        auStack_650 = (undefined1  [8])0x0;
        local_648._0_8_ = local_648._0_8_ & 0xffffffffffffff00;
        local_638._M_p = local_638._M_p & 0xffffffff00000000;
        aaStack_628[0]._8_8_ = (pointer)0x0;
        local_630 = (pointer)0x0;
        aaStack_628[0]._M_allocated_capacity = (pointer)0x0;
        std::
        vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
        emplace_back<deqp::gls::ub::BlockLayoutEntry>
                  (&local_6e8.blocks,(BlockLayoutEntry *)local_658);
        if (local_630 != (pointer)0x0) {
          operator_delete(local_630,aaStack_628[0]._8_8_ - (long)local_630);
        }
        if (local_658 != (undefined1  [8])(auStack_650 + 8)) {
          operator_delete((void *)local_658,local_648._0_8_ + 1);
        }
        pBVar22 = local_6e8.blocks.
                  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pBVar19 = local_6e8.blocks.
                  super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        __s._M_p = (local_7b8->m_blockName)._M_dataplus._M_p;
        pcVar23 = (char *)local_6e8.blocks.
                          super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].name._M_string_length;
        strlen(__s._M_p);
        std::__cxx11::string::_M_replace((ulong)pBVar19,0,pcVar23,(ulong)__s._M_p);
        pBVar22[-1].size = (int)local_6a0;
        local_658._0_4_ = (int)local_698;
        if ((int)local_698 < (int)uVar35) {
          uVar18 = local_698;
          do {
            __position._M_current =
                 pBVar22[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                pBVar22[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&pBVar22[-1].activeUniformIndices,
                         __position,(int *)local_658);
            }
            else {
              *__position._M_current = (int)uVar18;
              pBVar22[-1].activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            uVar38 = local_658._0_4_ + 1;
            uVar18 = (ulong)uVar38;
            local_658._0_4_ = uVar38;
          } while ((int)uVar38 < (int)uVar35);
        }
        if (0 < local_7b8->m_arraySize) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_658);
          std::ostream::operator<<((ostringstream *)local_658,local_780);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_658);
          std::ios_base::~ios_base(local_5e8);
          plVar17 = (long *)std::__cxx11::string::replace((ulong)local_778,0,(char *)0x0,0x1c8ed0e);
          plVar31 = plVar17 + 2;
          if ((pointer *)*plVar17 == (pointer *)plVar31) {
            local_278.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar31;
            local_278.m_shaders[1].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar17[3];
            local_278.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)pppSVar1;
          }
          else {
            local_278.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar31;
            local_278.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)*plVar17;
          }
          local_278.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)plVar17[1];
          *plVar17 = (long)plVar31;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          plVar17 = (long *)std::__cxx11::string::append((char *)&local_278);
          pp_Var30 = (_func_int **)(plVar17 + 2);
          if ((_func_int **)*plVar17 == pp_Var30) {
            local_198 = *pp_Var30;
            lStack_190 = plVar17[3];
            local_1a8._0_8_ = &local_198;
          }
          else {
            local_198 = *pp_Var30;
            local_1a8._0_8_ = (_func_int **)*plVar17;
          }
          local_1a8._8_8_ = plVar17[1];
          *plVar17 = (long)pp_Var30;
          plVar17[1] = 0;
          *(undefined1 *)(plVar17 + 2) = 0;
          std::__cxx11::string::_M_append((char *)pBVar19,local_1a8._0_8_);
          if ((_func_int **)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198 + 1));
          }
          if (local_278.m_shaders[0].
              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)pppSVar1) {
            operator_delete(local_278.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_278.m_shaders[0].
                                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
          }
          if ((undefined1 *)local_778._0_8_ != local_778 + 0x10) {
            operator_delete((void *)local_778._0_8_,local_778._16_8_ + 1);
          }
        }
        local_780 = local_780 + 1;
      } while (local_780 != (int)local_660);
      if ((_func_int **)local_3f0._0_8_ != &local_3e0) {
        operator_delete((void *)local_3f0._0_8_,(ulong)(local_3e0 + 1));
      }
      uVar35 = local_668 + 1;
    } while (uVar35 != local_700);
  }
  uVar35 = 0;
  pBVar19 = local_6e8.blocks.
            super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_6e8.blocks.
      super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_6e8.blocks.
      super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar38 = (int)uVar35 + pBVar19->size;
      uVar35 = (ulong)uVar38;
      pBVar19 = pBVar19 + 1;
    } while (pBVar19 !=
             local_6e8.blocks.
             super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    uVar35 = (ulong)(int)uVar38;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_4d8,uVar35);
  local_658 = (undefined1  [8])((ulong)local_658 & 0xffffffff00000000);
  if (0 < (int)((ulong)((long)local_6e8.blocks.
                              super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_6e8.blocks.
                             super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    iVar11 = 0;
    do {
      puVar9 = local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      ppvVar20 = std::
                 map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::
                 operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                             *)local_420,(key_type_conflict *)local_658);
      *ppvVar20 = puVar9 + iVar11;
      iVar28 = local_658._0_4_ + 1;
      iVar11 = iVar11 + local_6e8.blocks.
                        super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)local_658._0_4_].size;
      local_658._0_4_ = iVar28;
    } while (iVar28 < (int)((ulong)((long)local_6e8.blocks.
                                          super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_6e8.blocks.
                                         super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  deRandom_init((deRandom *)local_658,1);
  local_678 = (ulong)((long)local_6e8.blocks.
                            super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_6e8.blocks.
                           super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 6;
  if (0 < (int)(uint)local_678) {
    local_678 = (ulong)((uint)local_678 & 0x7fffffff);
    in_R9 = 0;
    do {
      pBVar42 = (pointer)(local_420 + 8);
      pBVar22 = pBVar42;
      pBVar36 = pBVar42;
      pBVar19 = local_410;
      if (local_410 != (pointer)0x0) {
        do {
          pBVar33 = pBVar19;
          pBVar21 = pBVar22;
          lVar37 = (long)pBVar33->size;
          pBVar22 = pBVar33;
          if (lVar37 < (long)in_R9) {
            pBVar22 = pBVar21;
          }
          pBVar19 = *(pointer *)((long)&(pBVar33->name).field_2 + (ulong)(lVar37 < (long)in_R9) * 8)
          ;
        } while (pBVar19 != (pointer)0x0);
        if (pBVar22 != pBVar42) {
          if (lVar37 < (long)in_R9) {
            pBVar33 = pBVar21;
          }
          pBVar36 = pBVar22;
          if ((long)in_R9 < (long)pBVar33->size) {
            pBVar36 = pBVar42;
          }
        }
      }
      local_440 = in_R9;
      local_438 = in_R9 * 0x40;
      local_670 = (ulong)((long)local_6e8.blocks.
                                super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_start[in_R9].
                                activeUniformIndices.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_6e8.blocks.
                               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start[in_R9].activeUniformIndices
                               .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2;
      uVar38 = (uint)local_670;
      if (0 < (int)uVar38) {
        local_428 = (pBVar36->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        local_670 = (ulong)(uVar38 & 0x7fffffff);
        uVar35 = 0;
        do {
          pUVar39 = local_6e8.uniforms.
                    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar11 = *(int *)(*(long *)((long)&((local_6e8.blocks.
                                               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             activeUniformIndices).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start + local_438) +
                           uVar35 * 4);
          DVar12 = glu::getDataTypeScalarType
                             (local_6e8.uniforms.
                              super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar11].type);
          pUVar39 = pUVar39 + iVar11;
          iVar11 = glu::getDataTypeScalarSize(pUVar39->type);
          DVar16 = pUVar39->type;
          bVar43 = DVar16 - TYPE_FLOAT_MAT2 < 9;
          bVar44 = DVar16 - TYPE_DOUBLE_MAT2 < 9;
          local_7b8 = (UniformBlock *)CONCAT44(local_7b8._4_4_,1);
          local_780 = CONCAT31(local_780._1_3_,bVar44 || bVar43);
          if (bVar44 || bVar43) {
            if (pUVar39->isRowMajor == true) {
              iVar28 = glu::getDataTypeMatrixNumRows(DVar16);
              local_7b8 = (UniformBlock *)CONCAT44(local_7b8._4_4_,iVar28);
            }
            else {
              iVar28 = glu::getDataTypeMatrixNumColumns(DVar16);
              local_7b8 = (UniformBlock *)CONCAT44(local_7b8._4_4_,iVar28);
            }
          }
          local_430 = uVar35;
          iVar28 = pUVar39->size;
          local_700 = CONCAT44(local_700._4_4_,iVar28);
          if (0 < iVar28) {
            uVar35 = (long)iVar11 / (long)(int)local_7b8 & 0xffffffff;
            local_698 = uVar35;
            iVar11 = 0;
            local_6a0 = pUVar39;
            do {
              iVar29 = pUVar39->arrayStride * iVar11;
              if ((int)local_700 < 2) {
                iVar29 = 0;
              }
              if (0 < (int)local_7b8) {
                local_668 = CONCAT44(local_668._4_4_,iVar11);
                local_660 = (long)local_428 + (long)iVar29 + (long)pUVar39->offset;
                iVar11 = 0;
                do {
                  lVar37 = (long)(pUVar39->matrixStride * iVar11);
                  if ((char)local_780 == '\0') {
                    lVar37 = 0;
                  }
                  if (0 < (int)local_698) {
                    lVar37 = lVar37 + local_660;
                    lVar40 = 0;
                    do {
                      if ((int)DVar12 < 0x1f) {
                        if (DVar12 == TYPE_FLOAT) {
                          dVar13 = deRandom_getUint32((deRandom *)local_658);
                          *(float *)(lVar37 + (int)lVar40) = (float)(int)(dVar13 % 0x13 - 9);
                        }
                        else if (DVar12 == TYPE_INT) {
                          dVar13 = deRandom_getUint32((deRandom *)local_658);
                          uVar38 = dVar13 % 0x13 - 9;
                          goto LAB_01850088;
                        }
                      }
                      else {
                        if (DVar12 == TYPE_UINT) {
                          dVar13 = deRandom_getUint32((deRandom *)local_658);
                          uVar38 = dVar13 % 10;
                        }
                        else {
                          if (DVar12 != TYPE_BOOL) goto LAB_0185008d;
                          dVar14 = deRandom_getBool((deRandom *)local_658);
                          uVar38 = 0;
                          if (dVar14 == 1) {
                            dVar13 = deRandom_getUint32((deRandom *)local_658);
                            uVar38 = dVar13 | 1;
                          }
                        }
LAB_01850088:
                        *(uint *)(lVar37 + (int)lVar40) = uVar38;
                      }
LAB_0185008d:
                      lVar40 = lVar40 + 4;
                    } while (uVar35 * 4 - lVar40 != 0);
                  }
                  iVar11 = iVar11 + 1;
                  pUVar39 = local_6a0;
                } while (iVar11 != (int)local_7b8);
                iVar28 = local_6a0->size;
                iVar11 = (int)local_668;
              }
              iVar11 = iVar11 + 1;
            } while (iVar11 < iVar28);
          }
          uVar35 = local_430 + 1;
        } while (uVar35 != local_670);
      }
      in_R9 = local_440 + 1;
    } while (in_R9 != local_678);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar23 = glu::getGLSLVersionDeclaration(local_7c8->m_glslVersion);
  if (pcVar23 == (char *)0x0) {
    std::ios::clear((int)&local_7d8 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 1000);
  }
  else {
    sVar24 = strlen(pcVar23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar23,sVar24);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"out mediump float v_vtxResult;\n",0x1f);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"\n",1);
  this_00 = &local_7c8->m_interface;
  local_658 = (undefined1  [8])0x0;
  auStack_650 = (undefined1  [8])0x0;
  local_648._0_8_ = 0;
  ub::ShaderInterface::getNamedStructs
            (this_00,(vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
                      *)local_658);
  if (local_658 != auStack_650) {
    auVar41 = local_658;
    do {
      ub::anon_unknown_12::generateFullDeclaration
                ((ostringstream *)local_3f0,*(StructType **)auVar41,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,";\n",2);
      auVar41 = (undefined1  [8])((long)auVar41 + 8);
    } while (auVar41 != auStack_650);
  }
  ppUVar25 = (local_7c8->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppUVar32 = (local_7c8->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppUVar32 - (long)ppUVar25) >> 3)) {
    lVar37 = 0;
    do {
      if ((ppUVar25[lVar37]->m_flags & 0x100) != 0) {
        ub::anon_unknown_12::generateDeclaration((ostringstream *)local_3f0,ppUVar25[lVar37]);
        ppUVar25 = (local_7c8->m_interface).m_uniformBlocks.
                   super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppUVar32 = (local_7c8->m_interface).m_uniformBlocks.
                   super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar37 = lVar37 + 1;
    } while (lVar37 < (int)((ulong)((long)ppUVar32 - (long)ppUVar25) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"\n",1);
  ub::anon_unknown_12::generateCompareFuncs((ostream *)local_3f0,this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,
             "\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tmediump float result = 1.0;\n",
             0x4c);
  ub::anon_unknown_12::generateCompareSrc
            ((ostringstream *)local_3f0,(char *)this_00,(ShaderInterface *)&local_6e8,
             (UniformLayout *)local_420,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             &DAT_00000001,SUB81(in_R9,0));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"\tv_vtxResult = result;\n}\n",0x19);
  if (local_658 != (undefined1  [8])0x0) {
    operator_delete((void *)local_658,local_648._0_8_ - (long)local_658);
  }
  pcVar23 = glu::getGLSLVersionDeclaration(local_7c8->m_glslVersion);
  if (pcVar23 == (char *)0x0) {
    std::ios::clear((int)&local_7d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x630);
  }
  else {
    sVar24 = strlen(pcVar23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar23,sVar24);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"in mediump float v_vtxResult;\n",0x1e);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  local_658 = (undefined1  [8])0x0;
  auStack_650 = (undefined1  [8])0x0;
  local_648._0_8_ = 0;
  ub::ShaderInterface::getNamedStructs
            (this_00,(vector<const_deqp::gls::ub::StructType_*,_std::allocator<const_deqp::gls::ub::StructType_*>_>
                      *)local_658);
  if (local_658 != auStack_650) {
    auVar41 = local_658;
    do {
      ub::anon_unknown_12::generateFullDeclaration
                ((ostringstream *)local_1a8,(StructType *)((TestLog *)auVar41)->m_log,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,";\n",2);
      auVar41 = (undefined1  [8])((long)auVar41 + 8);
    } while (auVar41 != auStack_650);
  }
  isVertex = (undefined1)in_R9;
  ppUVar25 = (local_7c8->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppUVar32 = (local_7c8->m_interface).m_uniformBlocks.
             super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppUVar32 - (long)ppUVar25) >> 3)) {
    lVar37 = 0;
    do {
      if ((ppUVar25[lVar37]->m_flags & 0x200) != 0) {
        ub::anon_unknown_12::generateDeclaration((ostringstream *)local_1a8,ppUVar25[lVar37]);
        ppUVar25 = (local_7c8->m_interface).m_uniformBlocks.
                   super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppUVar32 = (local_7c8->m_interface).m_uniformBlocks.
                   super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      isVertex = (undefined1)in_R9;
      lVar37 = lVar37 + 1;
    } while (lVar37 < (int)((ulong)((long)ppUVar32 - (long)ppUVar25) >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  ub::anon_unknown_12::generateCompareFuncs((ostream *)local_1a8,this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nvoid main (void)\n{\n\tmediump float result = 1.0;\n",0x31);
  ub::anon_unknown_12::generateCompareSrc
            ((ostringstream *)local_1a8,(char *)this_00,(ShaderInterface *)&local_6e8,
             (UniformLayout *)local_420,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)0x0
             ,(bool)isVertex);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\tdEQP_FragColor = vec4(1.0, v_vtxResult, result, 1.0);\n}\n",
             0x39);
  if (local_658 != (undefined1  [8])0x0) {
    operator_delete((void *)local_658,local_648._0_8_ - (long)local_658);
  }
  renderCtx = local_7c8->m_renderCtx;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_658,0,0xac);
  local_5a8._0_8_ = (pointer)0x0;
  local_5a8[8] = 0;
  local_5a8._9_7_ = 0;
  local_5a8[0x10] = 0;
  local_5a8._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_658,(value_type *)local_778);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_648 + 8),(value_type *)local_7b0);
  glu::ShaderProgram::ShaderProgram(&local_278,renderCtx,(ProgramSources *)local_658);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5a8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_5c8);
  lVar37 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_658 + lVar37));
    lVar37 = lVar37 + -0x18;
  } while (lVar37 != -0x18);
  if ((undefined1 *)local_7b0._0_8_ != local_7b0 + 0x10) {
    operator_delete((void *)local_7b0._0_8_,local_7b0._16_8_ + 1);
  }
  lVar37 = local_7c0;
  if ((undefined1 *)local_778._0_8_ != local_778 + 0x10) {
    operator_delete((void *)local_778._0_8_,local_778._16_8_ + 1);
  }
  glu::operator<<(local_740,&local_278);
  dVar13 = local_278.m_program.m_program;
  if (local_278.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((local_7c8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compile failed");
  }
  else {
    vStack_760.
    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_760.
    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_778._16_8_ = 0;
    vStack_760.
    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_778._0_8_ = (pointer)0x0;
    local_778._8_8_ = (pointer)0x0;
    local_7cc = 0;
    local_77c = 0;
    (**(code **)(lVar37 + 0x9d8))(local_278.m_program.m_program,0x8b86);
    (**(code **)(lVar37 + 0x9d8))(dVar13,0x8a36,&local_77c);
    dVar15 = (**(code **)(lVar37 + 0x800))();
    glu::checkError(dVar15,"Failed to get number of uniforms and uniform blocks",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                    ,0x497);
    std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
    resize((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
            *)local_778,(long)local_77c);
    if (0 < local_77c) {
      lVar37 = 0x28;
      uVar35 = 0;
      do {
        uVar8 = local_778._0_8_;
        lVar40 = local_7c0;
        (**(code **)(local_7c0 + 0x760))(dVar13,uVar35 & 0xffffffff,0x8a40,&local_738);
        (**(code **)(lVar40 + 0x760))(dVar13,uVar35 & 0xffffffff,0x8a41,&local_718);
        (**(code **)(lVar40 + 0x760))(dVar13,uVar35 & 0xffffffff,0x8a42,&local_690);
        dVar15 = (**(code **)(lVar40 + 0x800))();
        glu::checkError(dVar15,"Uniform block query failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                        ,0x4a6);
        uVar38 = (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if ((int)(uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start < 2) {
          uVar38 = 1;
        }
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_7b0,(ulong)uVar38,
                   (allocator_type *)local_658);
        (**(code **)(local_7c0 + 0x758))
                  (dVar13,uVar35 & 0xffffffff,local_7b0._8_4_ - (int)local_7b0._0_8_,0);
        uVar7 = local_7b0._0_8_;
        local_658 = (undefined1  [8])(auStack_650 + 8);
        if ((char *)local_7b0._0_8_ == (char *)0x0) {
          pcVar23 = &DAT_00000001;
        }
        else {
          sVar24 = strlen((char *)local_7b0._0_8_);
          pcVar23 = (char *)(uVar7 + sVar24);
        }
        std::__cxx11::string::_M_construct<char_const*>((string *)local_658,uVar7,pcVar23);
        std::__cxx11::string::operator=((string *)(uVar8 + lVar37 + -0x28),(string *)local_658);
        if (local_658 != (undefined1  [8])(auStack_650 + 8)) {
          operator_delete((void *)local_658,local_648._0_8_ + 1);
        }
        *(undefined4 *)(uVar8 + lVar37 + -8) = local_738._M_dataplus._M_p._0_4_;
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)(uVar8 + lVar37),
                   (long)(int)local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        if (0 < (int)local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) {
          (**(code **)(local_7c0 + 0x760))
                    (dVar13,uVar35 & 0xffffffff,0x8a43,
                     (((vector<int,_std::allocator<int>_> *)(uVar8 + lVar37))->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start);
        }
        dVar15 = (**(code **)(local_7c0 + 0x800))();
        glu::checkError(dVar15,"Uniform block query failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                        ,0x4b3);
        if ((char *)local_7b0._0_8_ != (char *)0x0) {
          operator_delete((void *)local_7b0._0_8_,local_7b0._16_8_ - local_7b0._0_8_);
        }
        uVar35 = uVar35 + 1;
        lVar37 = lVar37 + 0x40;
      } while ((long)uVar35 < (long)local_77c);
    }
    lVar37 = local_7c0;
    if (0 < (long)local_7cc) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_7b0,(long)local_7cc,
                 (allocator_type *)local_658);
      if (0 < local_7cc) {
        lVar40 = 0;
        do {
          *(int *)(local_7b0._0_8_ + lVar40 * 4) = (int)lVar40;
          lVar40 = lVar40 + 1;
        } while (lVar40 < local_7cc);
      }
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_738,(long)local_7cc,
                 (allocator_type *)local_658);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_718,(long)local_7cc,(allocator_type *)local_658);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_690,(long)local_7cc,(allocator_type *)local_658);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_6b8,(long)local_7cc,(allocator_type *)local_658);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_458,(long)local_7cc,(allocator_type *)local_658);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_470,(long)local_7cc,(allocator_type *)local_658);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_488,(long)local_7cc,(allocator_type *)local_658);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_4a0,(long)local_7cc,(allocator_type *)local_658);
      (**(code **)(lVar37 + 0x770))
                (dVar13,(ulong)(CONCAT44(local_7b0._12_4_,local_7b0._8_4_) - local_7b0._0_8_) >> 2,
                 local_7b0._0_8_,0x8a37,local_738._M_dataplus._M_p);
      (**(code **)(lVar37 + 0x770))
                (dVar13,(ulong)(CONCAT44(local_7b0._12_4_,local_7b0._8_4_) - local_7b0._0_8_) >> 2,
                 local_7b0._0_8_,0x8a38,
                 CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start));
      (**(code **)(lVar37 + 0x770))
                (dVar13,(ulong)(CONCAT44(local_7b0._12_4_,local_7b0._8_4_) - local_7b0._0_8_) >> 2,
                 local_7b0._0_8_,0x8a39,
                 CONCAT44(local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start));
      (**(code **)(lVar37 + 0x770))
                (dVar13,(ulong)(CONCAT44(local_7b0._12_4_,local_7b0._8_4_) - local_7b0._0_8_) >> 2,
                 local_7b0._0_8_,0x8a3a,
                 CONCAT44(local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start));
      (**(code **)(lVar37 + 0x770))
                (dVar13,(ulong)(CONCAT44(local_7b0._12_4_,local_7b0._8_4_) - local_7b0._0_8_) >> 2,
                 local_7b0._0_8_,0x8a3b,
                 local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar37 + 0x770))
                (dVar13,(ulong)(CONCAT44(local_7b0._12_4_,local_7b0._8_4_) - local_7b0._0_8_) >> 2,
                 local_7b0._0_8_,0x8a3c,
                 local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar37 + 0x770))
                (dVar13,(ulong)(CONCAT44(local_7b0._12_4_,local_7b0._8_4_) - local_7b0._0_8_) >> 2,
                 local_7b0._0_8_,0x8a3d,
                 local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      (**(code **)(lVar37 + 0x770))
                (dVar13,(ulong)(CONCAT44(local_7b0._12_4_,local_7b0._8_4_) - local_7b0._0_8_) >> 2,
                 local_7b0._0_8_,0x8a3e,
                 local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar15 = (**(code **)(lVar37 + 0x800))();
      glu::checkError(dVar15,"Active uniform query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                      ,0x4d0);
      std::
      vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
      ::resize(&vStack_760,(long)local_7cc);
      if (0 < local_7cc) {
        lVar37 = 0;
        uVar35 = 0;
        do {
          pUVar39 = vStack_760.
                    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::vector<char,_std::allocator<char>_>::vector
                    (&local_4b8,
                     (long)*(int *)(CONCAT44(local_690.super__Vector_base<int,_std::allocator<int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             (int)local_690.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) +
                                   uVar35 * 4),(allocator_type *)local_658);
          local_6ec = 0;
          local_6f0 = 0;
          local_6f4 = 0;
          local_7d8 = local_4b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start;
          (**(code **)(local_7c0 + 0x750))
                    (dVar13,uVar35 & 0xffffffff,
                     (int)local_4b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                     (int)local_4b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,&local_6ec,&local_6f0,&local_6f4);
          dVar15 = (**(code **)(local_7c0 + 0x800))();
          glu::checkError(dVar15,"Uniform name query failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                          ,0x4de);
          pcVar10 = local_4b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (((local_6ec + 1 !=
                *(int *)(CONCAT44(local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (int)local_690.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) + uVar35 * 4)) ||
              (local_6f0 !=
               *(int *)(CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,
                                 (uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) + uVar35 * 4))) ||
             (local_6f4 != *(int *)(local_738._M_dataplus._M_p + uVar35 * 4))) {
            this_01 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_01,
                       "Values returned by glGetActiveUniform() don\'t match with values queried with glGetActiveUniformsiv()."
                       ,(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                       ,0x4e4);
            __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          local_658 = (undefined1  [8])(auStack_650 + 8);
          if (local_4b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start == (char *)0x0) {
            pcVar23 = &DAT_00000001;
          }
          else {
            sVar24 = strlen(local_4b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
            pcVar23 = pcVar10 + sVar24;
          }
          std::__cxx11::string::_M_construct<char_const*>((string *)local_658,pcVar10,pcVar23);
          std::__cxx11::string::operator=((string *)((long)pUVar39 + lVar37),(string *)local_658);
          if (local_658 != (undefined1  [8])(auStack_650 + 8)) {
            operator_delete((void *)local_658,local_648._0_8_ + 1);
          }
          DVar16 = glu::getDataTypeFromGLType
                             (*(deUint32 *)(local_738._M_dataplus._M_p + uVar35 * 4));
          *(DataType *)((long)pUVar39 + 0x20 + lVar37) = DVar16;
          *(undefined4 *)((long)pUVar39 + 0x24 + lVar37) =
               *(undefined4 *)
                (CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) + uVar35 * 4);
          *(undefined4 *)((long)pUVar39 + 0x28 + lVar37) =
               *(undefined4 *)
                (CONCAT44(local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) + uVar35 * 4);
          *(int *)((long)pUVar39 + 0x2c + lVar37) =
               local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar35];
          *(int *)((long)pUVar39 + 0x30 + lVar37) =
               local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar35];
          *(int *)((long)pUVar39 + 0x34 + lVar37) =
               local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar35];
          *(bool *)((long)pUVar39 + 0x38 + lVar37) =
               local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar35] != 0;
          if (local_4b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (char *)0x0) {
            operator_delete(local_4b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_4b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_4b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          uVar35 = uVar35 + 1;
          lVar37 = lVar37 + 0x40;
        } while ((long)uVar35 < (long)local_7cc);
      }
      if (local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_470.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_458.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pvVar5 = (void *)CONCAT44(local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
      }
      pvVar5 = (void *)CONCAT44(local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (int)local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_start);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
      }
      pvVar5 = (void *)CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                (uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                     .super__Vector_impl_data._M_end_of_storage - (long)pvVar5);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_738._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_738._M_dataplus._M_p,
                        local_738.field_2._M_allocated_capacity - (long)local_738._M_dataplus._M_p);
      }
      if ((char *)local_7b0._0_8_ != (char *)0x0) {
        operator_delete((void *)local_7b0._0_8_,local_7b0._16_8_ - local_7b0._0_8_);
      }
    }
    local_7b0._0_8_ = local_7b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7b0,"ActiveUniformBlocks","");
    local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"Active Uniform Blocks","")
    ;
    tcu::LogSection::LogSection((LogSection *)local_658,(string *)local_7b0,&local_738);
    tcu::TestLog::startSection(local_740,(char *)local_658,local_638._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_p != aaStack_628) {
      operator_delete(local_638._M_p,(ulong)(aaStack_628[0]._M_allocated_capacity + 1));
    }
    if (local_658 != (undefined1  [8])(auStack_650 + 8)) {
      operator_delete((void *)local_658,local_648._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_738._M_dataplus._M_p != &local_738.field_2) {
      operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7b0._0_8_ != local_7b0 + 0x10) {
      operator_delete((void *)local_7b0._0_8_,local_7b0._16_8_ + 1);
    }
    if (0 < (int)((ulong)(local_778._8_8_ - local_778._0_8_) >> 6)) {
      lVar37 = 0;
      lVar40 = 0;
      do {
        local_658 = (undefined1  [8])local_740;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_650);
        std::ostream::operator<<((ostringstream *)auStack_650,(int)lVar40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_650,": ",2);
        ub::operator<<((ostream *)auStack_650,(BlockLayoutEntry *)(local_778._0_8_ + lVar37));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_658,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_650);
        std::ios_base::~ios_base(local_5e0);
        lVar40 = lVar40 + 1;
        lVar37 = lVar37 + 0x40;
      } while (lVar40 < (int)((ulong)(local_778._8_8_ - local_778._0_8_) >> 6));
    }
    tcu::TestLog::endSection(local_740);
    local_7b0._0_8_ = local_7b0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7b0,"ActiveUniforms","");
    local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"Active Uniforms","");
    tcu::LogSection::LogSection((LogSection *)local_658,(string *)local_7b0,&local_738);
    tcu::TestLog::startSection(local_740,(char *)local_658,local_638._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_638._M_p != aaStack_628) {
      operator_delete(local_638._M_p,(ulong)(aaStack_628[0]._M_allocated_capacity + 1));
    }
    if (local_658 != (undefined1  [8])(auStack_650 + 8)) {
      operator_delete((void *)local_658,local_648._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_738._M_dataplus._M_p != &local_738.field_2) {
      operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_7b0._0_8_ != local_7b0 + 0x10) {
      operator_delete((void *)local_7b0._0_8_,local_7b0._16_8_ + 1);
    }
    if (0 < (int)((ulong)((long)vStack_760.
                                super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)vStack_760.
                               super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
      lVar37 = 0;
      lVar40 = 0;
      do {
        local_658 = (undefined1  [8])local_740;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_650);
        std::ostream::operator<<((ostringstream *)auStack_650,(int)lVar40);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_650,": ",2);
        ub::operator<<((ostream *)auStack_650,
                       (UniformLayoutEntry *)
                       ((long)vStack_760.
                              super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar37));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_658,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_650);
        std::ios_base::~ios_base(local_5e0);
        lVar40 = lVar40 + 1;
        lVar37 = lVar37 + 0x40;
      } while (lVar40 < (int)((ulong)((long)vStack_760.
                                            super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)vStack_760.
                                           super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 6));
    }
    tcu::TestLog::endSection(local_740);
    lVar37 = local_7c0;
    bVar43 = checkLayoutIndices(local_7c8,(UniformLayout *)local_778);
    if (((bVar43) && (bVar43 = checkLayoutBounds(local_7c8,(UniformLayout *)local_778), bVar43)) &&
       (bVar43 = compareTypes(local_7c8,&local_6e8,(UniformLayout *)local_778), bVar43)) {
      bVar43 = compareStd140Blocks(local_7c8,&local_6e8,(UniformLayout *)local_778);
      if (!bVar43) {
        tcu::TestContext::setTestResult
                  ((local_7c8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Invalid std140 layout");
      }
      bVar43 = compareSharedBlocks(local_7c8,&local_6e8,(UniformLayout *)local_778);
      if (!bVar43) {
        tcu::TestContext::setTestResult
                  ((local_7c8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Invalid shared layout");
      }
      bVar43 = checkIndexQueries(local_7c8,local_278.m_program.m_program,(UniformLayout *)local_778)
      ;
      if (!bVar43) {
        tcu::TestContext::setTestResult
                  ((local_7c8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Inconsintent block index query results");
      }
      (**(code **)(lVar37 + 0x1680))(local_278.m_program.m_program);
      if (0 < (int)((ulong)(local_778._8_8_ - local_778._0_8_) >> 6)) {
        iVar11 = 0;
        do {
          (**(code **)(local_7c0 + 0x15d0))(local_278.m_program.m_program,iVar11,iVar11);
          iVar11 = iVar11 + 1;
        } while (iVar11 < (int)((ulong)(local_778._8_8_ - local_778._0_8_) >> 6));
      }
      lVar37 = local_7c0;
      dVar13 = (**(code **)(local_7c0 + 0x800))();
      glu::checkError(dVar13,"Failed to set uniform block bindings",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                      ,0x5cf);
      local_738._M_dataplus._M_p = (pointer)local_7c8->m_renderCtx;
      local_738._M_string_length = 0;
      local_738.field_2._M_allocated_capacity = 0;
      local_738.field_2._8_8_ = 0;
      uVar38 = (uint)((ulong)(local_778._8_8_ - local_778._0_8_) >> 6);
      if (local_7c8->m_bufferMode == BUFFERMODE_PER_BLOCK) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_7b0,(long)(int)uVar38,(allocator_type *)local_658);
        local_648._8_8_ = auStack_650;
        auStack_650 = (undefined1  [8])((ulong)auStack_650 & 0xffffffff00000000);
        local_648._0_8_ = 0;
        local_630 = (pointer)0x0;
        local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        local_638._M_p = (pointer)local_648._8_8_;
        if (0 < (int)uVar38) {
          do {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       (local_7b0._0_8_ +
                       (long)(int)(uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start * 0x18),
                       (long)*(int *)(local_778._0_8_ +
                                     (long)(int)(uint)local_718.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start *
                                     0x40 + 0x20));
            pvVar3 = *(mapped_type *)
                      (local_7b0._0_8_ +
                      (long)(int)(uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start * 0x18);
            ppvVar20 = std::
                       map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                       ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                     *)local_658,(key_type_conflict *)&local_718);
            *ppvVar20 = pvVar3;
            local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 1;
          } while ((int)(uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start < (int)uVar38);
        }
        ub::anon_unknown_12::copyUniformData
                  ((UniformLayout *)local_778,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_658,&local_6e8,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_420);
        if (0 < (int)uVar38) {
          lVar37 = 8;
          uVar35 = 0;
          do {
            dVar13 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)&local_738);
            (**(code **)(local_7c0 + 0x40))(0x8a11,dVar13);
            (**(code **)(local_7c0 + 0x150))
                      (0x8a11,*(long *)(local_7b0._0_8_ + lVar37) -
                              *(long *)(local_7b0._0_8_ + lVar37 + -8),
                       *(long *)(local_7b0._0_8_ + lVar37 + -8),0x88e4);
            dVar15 = (**(code **)(local_7c0 + 0x800))();
            glu::checkError(dVar15,"Failed to upload uniform buffer data",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                            ,0x5e8);
            (**(code **)(local_7c0 + 0x48))(0x8a11,uVar35 & 0xffffffff,dVar13);
            dVar13 = (**(code **)(local_7c0 + 0x800))();
            glu::checkError(dVar13,"glBindBufferBase(GL_UNIFORM_BUFFER) failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                            ,0x5eb);
            uVar35 = uVar35 + 1;
            lVar37 = lVar37 + 0x18;
          } while ((uVar38 & 0x7fffffff) != uVar35);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     *)local_658);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_7b0);
      }
      else {
        local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        local_648._8_8_ = auStack_650;
        auStack_650 = (undefined1  [8])((ulong)auStack_650 & 0xffffffff00000000);
        local_648._0_8_ = 0;
        local_630 = (pointer)0x0;
        local_638._M_p = (pointer)local_648._8_8_;
        (**(code **)(lVar37 + 0x868))(0x8a34);
        local_7b0._0_8_ = local_7b0._0_8_ & 0xffffffff00000000;
        uVar35 = 0;
        if (0 < (int)uVar38) {
          do {
            iVar11 = (int)uVar35;
            if ((0 < (int)local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) &&
               ((iVar11 / (int)local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) *
                (int)local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start != iVar11)) {
              iVar11 = (iVar11 / (int)local_690.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start + 1) *
                       (int)local_690.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
            }
            pmVar26 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_658,(key_type_conflict *)local_7b0);
            *pmVar26 = iVar11;
            lVar37 = (long)(int)local_7b0._0_4_;
            iVar28 = local_7b0._0_4_ + 1;
            uVar35 = (ulong)(uint)(iVar11 + *(int *)(local_778._0_8_ + lVar37 * 0x40 + 0x20));
            local_7b0._0_4_ = iVar28;
          } while (iVar28 < (int)uVar38);
          uVar35 = (ulong)(iVar11 + *(int *)(local_778._0_8_ + lVar37 * 0x40 + 0x20));
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_718,uVar35,
                   (allocator_type *)local_7b0);
        local_7b0._24_8_ = local_7b0 + 8;
        local_7b0._8_4_ = _S_red;
        local_7b0._16_8_ = 0;
        local_788 = 0;
        local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        local_790 = (_Base_ptr)local_7b0._24_8_;
        if (0 < (int)uVar38) {
          do {
            pmVar26 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_658,(key_type_conflict *)&local_6b8);
            iVar11 = *pmVar26;
            lVar37 = CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (uint)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            ppvVar20 = std::
                       map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                       ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                     *)local_7b0,(key_type_conflict *)&local_6b8);
            *ppvVar20 = (mapped_type)(lVar37 + iVar11);
            local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (int)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
          } while ((int)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start < (int)uVar38);
        }
        ub::anon_unknown_12::copyUniformData
                  ((UniformLayout *)local_778,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_7b0,&local_6e8,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_420);
        dVar13 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)&local_738);
        (**(code **)(local_7c0 + 0x40))(0x8a11,dVar13);
        piVar6 = (pointer)CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start);
        if (piVar6 != local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          (**(code **)(local_7c0 + 0x150))
                    (0x8a11,(long)local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar6,piVar6,0x88e4);
        }
        dVar15 = (**(code **)(local_7c0 + 0x800))();
        glu::checkError(dVar15,"Failed to upload uniform buffer data",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                        ,0x615);
        local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        if (0 < (int)uVar38) {
          do {
            iVar11 = (int)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
            pcVar4 = *(code **)(local_7c0 + 0x50);
            pmVar26 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_658,(key_type_conflict *)&local_6b8);
            (*pcVar4)(0x8a11,iVar11,dVar13,(long)*pmVar26,
                      (long)*(int *)(local_778._0_8_ +
                                    (long)(int)local_6b8.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start * 0x40 + 0x20));
            dVar15 = (**(code **)(local_7c0 + 0x800))();
            glu::checkError(dVar15,"glBindBufferRange(GL_UNIFORM_BUFFER) failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                            ,0x61c);
            local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ =
                 (int)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
          } while ((int)local_6b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start < (int)uVar38);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     *)local_7b0);
        pvVar5 = (void *)CONCAT44(local_718.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  (uint)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,(long)local_718.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar5);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)local_658);
      }
      bVar43 = render(local_7c8,local_278.m_program.m_program);
      if (!bVar43) {
        tcu::TestContext::setTestResult
                  ((local_7c8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Image compare failed");
      }
      ub::UniformBufferManager::~UniformBufferManager((UniformBufferManager *)&local_738);
    }
    else {
      tcu::TestContext::setTestResult
                ((local_7c8->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid layout");
    }
    std::
    vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>::
    ~vector(&vStack_760);
    std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
    ~vector((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
             *)local_778);
  }
  glu::ShaderProgram::~ShaderProgram(&local_278);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
  std::ios_base::~ios_base(local_380);
  std::
  _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *)local_420);
  if (local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_4d8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_4d8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
  ::~vector(&local_6e8.uniforms);
  std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
  ~vector(&local_6e8.blocks);
  return STOP;
}

Assistant:

UniformBlockCase::IterateResult UniformBlockCase::iterate (void)
{
	TestLog&				log				= m_testCtx.getLog();
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	UniformLayout			refLayout;		//!< std140 layout.
	vector<deUint8>			data;			//!< Data.
	map<int, void*>			blockPointers;	//!< Reference block pointers.

	// Initialize result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Compute reference layout.
	computeStd140Layout(refLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (vector<BlockLayoutEntry>::const_iterator blockIter = refLayout.blocks.begin(); blockIter != refLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)refLayout.blocks.size(); blockNdx++)
		{
			blockPointers[blockNdx] = &data[0] + curOffset;
			curOffset += refLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(refLayout, blockPointers, 1 /* seed */);

	// Generate shaders and build program.
	std::ostringstream vtxSrc;
	std::ostringstream fragSrc;

	generateVertexShader(vtxSrc, m_glslVersion, m_interface, refLayout, blockPointers);
	generateFragmentShader(fragSrc, m_glslVersion, m_interface, refLayout, blockPointers);

	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(vtxSrc.str(), fragSrc.str()));
	log << program;

	if (!program.isOk())
	{
		// Compile failed.
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Query layout from GL.
	UniformLayout glLayout;
	getGLUniformLayout(gl, glLayout, program.getProgram());

	// Print layout to log.
	log << TestLog::Section("ActiveUniformBlocks", "Active Uniform Blocks");
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
		log << TestLog::Message << blockNdx << ": " << glLayout.blocks[blockNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	log << TestLog::Section("ActiveUniforms", "Active Uniforms");
	for (int uniformNdx = 0; uniformNdx < (int)glLayout.uniforms.size(); uniformNdx++)
		log << TestLog::Message << uniformNdx << ": " << glLayout.uniforms[uniformNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	// Check that we can even try rendering with given layout.
	if (!checkLayoutIndices(glLayout) || !checkLayoutBounds(glLayout) || !compareTypes(refLayout, glLayout))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid layout");
		return STOP; // It is not safe to use the given layout.
	}

	// Verify all std140 blocks.
	if (!compareStd140Blocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid std140 layout");

	// Verify all shared blocks - all uniforms should be active, and certain properties match.
	if (!compareSharedBlocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid shared layout");

	// Check consistency with index queries
	if (!checkIndexQueries(program.getProgram(), glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsintent block index query results");

	// Use program.
	gl.useProgram(program.getProgram());

	// Assign binding points to all active uniform blocks.
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
	{
		deUint32 binding = (deUint32)blockNdx; // \todo [2012-01-25 pyry] Randomize order?
		gl.uniformBlockBinding(program.getProgram(), (deUint32)blockNdx, binding);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set uniform block bindings");

	// Allocate buffers, write data and bind to targets.
	UniformBufferManager bufferManager(m_renderCtx);
	if (m_bufferMode == BUFFERMODE_PER_BLOCK)
	{
		int							numBlocks			= (int)glLayout.blocks.size();
		vector<vector<deUint8> >	glData				(numBlocks);
		map<int, void*>				glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			glData[blockNdx].resize(glLayout.blocks[blockNdx].size);
			glBlockPointers[blockNdx] = &glData[blockNdx][0];
		}

		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32	buffer	= bufferManager.allocBuffer();
			deUint32	binding	= (deUint32)blockNdx;

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData[blockNdx].size(), &glData[blockNdx][0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, binding, buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase(GL_UNIFORM_BUFFER) failed");
		}
	}
	else
	{
		DE_ASSERT(m_bufferMode == BUFFERMODE_SINGLE);

		int				totalSize			= 0;
		int				curOffset			= 0;
		int				numBlocks			= (int)glLayout.blocks.size();
		int				bindingAlignment	= 0;
		map<int, int>	glBlockOffsets;

		gl.getIntegerv(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT, &bindingAlignment);

		// Compute total size and offsets.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			if (bindingAlignment > 0)
				curOffset = deRoundUp32(curOffset, bindingAlignment);
			glBlockOffsets[blockNdx] = curOffset;
			curOffset += glLayout.blocks[blockNdx].size;
		}
		totalSize = curOffset;

		// Assign block pointers.
		vector<deUint8>	glData(totalSize);
		map<int, void*>	glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			glBlockPointers[blockNdx] = &glData[glBlockOffsets[blockNdx]];

		// Copy to gl format.
		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		// Allocate buffer and upload data.
		deUint32 buffer = bufferManager.allocBuffer();
		gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
		if (!glData.empty())
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData.size(), &glData[0], GL_STATIC_DRAW);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

		// Bind ranges to binding points.
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 binding = (deUint32)blockNdx;
			gl.bindBufferRange(GL_UNIFORM_BUFFER, binding, buffer, (glw::GLintptr)glBlockOffsets[blockNdx], (glw::GLsizeiptr)glLayout.blocks[blockNdx].size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange(GL_UNIFORM_BUFFER) failed");
		}
	}

	bool renderOk = render(program.getProgram());
	if (!renderOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");

	return STOP;
}